

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NearestNeighborsIndex::clear_IndexType(NearestNeighborsIndex *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  SingleKdTreeIndex *this_00;
  
  if (this->_oneof_case_[0] == 0x6e) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto LAB_001d2119;
    this_00 = (this->IndexType_).singlekdtreeindex_;
    if (this_00 != (SingleKdTreeIndex *)0x0) {
      SingleKdTreeIndex::~SingleKdTreeIndex(this_00);
    }
  }
  else {
    if (this->_oneof_case_[0] != 100) goto LAB_001d2119;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto LAB_001d2119;
    this_00 = (SingleKdTreeIndex *)(this->IndexType_).linearindex_;
    if (this_00 != (SingleKdTreeIndex *)0x0) {
      LinearIndex::~LinearIndex((LinearIndex *)this_00);
    }
  }
  operator_delete(this_00,0x18);
LAB_001d2119:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void NearestNeighborsIndex::clear_IndexType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NearestNeighborsIndex)
  switch (IndexType_case()) {
    case kLinearIndex: {
      if (GetArenaForAllocation() == nullptr) {
        delete IndexType_.linearindex_;
      }
      break;
    }
    case kSingleKdTreeIndex: {
      if (GetArenaForAllocation() == nullptr) {
        delete IndexType_.singlekdtreeindex_;
      }
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = INDEXTYPE_NOT_SET;
}